

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.c
# Opt level: O0

void cmsysBase64_Encode3(uchar *src,uchar *dest)

{
  uchar uVar1;
  uchar *dest_local;
  uchar *src_local;
  
  uVar1 = kwsysBase64EncodeChar((int)(uint)*src >> 2);
  *dest = uVar1;
  uVar1 = kwsysBase64EncodeChar((*src & 3) << 4 | (int)(uint)src[1] >> 4);
  dest[1] = uVar1;
  uVar1 = kwsysBase64EncodeChar((src[1] & 0xf) << 2 | (int)(uint)src[2] >> 6);
  dest[2] = uVar1;
  uVar1 = kwsysBase64EncodeChar(src[2] & 0x3f);
  dest[3] = uVar1;
  return;
}

Assistant:

void kwsysBase64_Encode3(const unsigned char* src, unsigned char* dest)
{
  dest[0] = kwsysBase64EncodeChar((src[0] >> 2) & 0x3F);
  dest[1] =
    kwsysBase64EncodeChar(((src[0] << 4) & 0x30) | ((src[1] >> 4) & 0x0F));
  dest[2] =
    kwsysBase64EncodeChar(((src[1] << 2) & 0x3C) | ((src[2] >> 6) & 0x03));
  dest[3] = kwsysBase64EncodeChar(src[2] & 0x3F);
}